

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

void __thiscall simple_json::Stream::emit_json_key(Stream *this,string *key)

{
  bool bVar1;
  reference pvVar2;
  CompilerError *this_00;
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *key_local;
  Stream *this_local;
  
  local_18 = key;
  key_local = (string *)this;
  bVar1 = std::
          stack<std::pair<simple_json::Type,_bool>,_std::deque<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>_>
          ::empty(&this->stack);
  if (!bVar1) {
    pvVar2 = std::
             stack<std::pair<simple_json::Type,_bool>,_std::deque<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>_>
             ::top(&this->stack);
    if (pvVar2->first == Object) {
      pvVar2 = std::
               stack<std::pair<simple_json::Type,_bool>,_std::deque<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>_>
               ::top(&this->stack);
      if ((pvVar2->second & 1U) != 0) {
        statement_inner<char_const(&)[3]>(this,(char (*) [3])",\n");
      }
      statement_no_return<char_const(&)[2],std::__cxx11::string_const&,char_const(&)[5]>
                (this,(char (*) [2])0x5eafb9,local_18,(char (*) [5])"\" : ");
      pvVar2 = std::
               stack<std::pair<simple_json::Type,_bool>,_std::deque<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>_>
               ::top(&this->stack);
      pvVar2->second = true;
      return;
    }
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Invalid JSON state",&local_39);
  spirv_cross::CompilerError::CompilerError(this_00,(string *)local_38);
  __cxa_throw(this_00,&spirv_cross::CompilerError::typeinfo,
              spirv_cross::CompilerError::~CompilerError);
}

Assistant:

void Stream::emit_json_key(const std::string &key)
{
	if (stack.empty() || stack.top().first != Type::Object)
		SPIRV_CROSS_THROW("Invalid JSON state");

	if (stack.top().second)
		statement_inner(",\n");
	statement_no_return("\"", key, "\" : ");
	stack.top().second = true;
}